

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::VirtualInterfaceTypeSyntax::setChild
          (VirtualInterfaceTypeSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  DotMemberClauseSyntax *local_150;
  ParameterValueAssignmentSyntax *local_148;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  VirtualInterfaceTypeSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->virtualKeyword).kind = (undefined2)local_28;
    (this->virtualKeyword).field_0x2 = local_28._2_1_;
    (this->virtualKeyword).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->virtualKeyword).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->virtualKeyword).info = local_20;
    break;
  case 1:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar2._0_8_;
    (this->interfaceKeyword).kind = (undefined2)local_38;
    (this->interfaceKeyword).field_0x2 = local_38._2_1_;
    (this->interfaceKeyword).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->interfaceKeyword).rawLen = local_38._4_4_;
    local_30 = TVar2.info;
    (this->interfaceKeyword).info = local_30;
    break;
  case 2:
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar2._0_8_;
    (this->name).kind = (undefined2)local_48;
    (this->name).field_0x2 = local_48._2_1_;
    (this->name).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->name).rawLen = local_48._4_4_;
    local_40 = TVar2.info;
    (this->name).info = local_40;
    break;
  case 3:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_148 = (ParameterValueAssignmentSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::ParameterValueAssignmentSyntax>(pSVar1);
    }
    this->parameters = local_148;
    break;
  case 4:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_150 = (DotMemberClauseSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_150 = SyntaxNode::as<slang::syntax::DotMemberClauseSyntax>(pSVar1);
    }
    this->modport = local_150;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_e9);
    std::operator+(&local_c8,&local_e8,":");
    std::__cxx11::to_string(&local_120,0x35e3);
    std::operator+(&local_a8,&local_c8,&local_120);
    std::operator+(&local_88,&local_a8,": ");
    std::operator+(&local_68,&local_88,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_68);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void VirtualInterfaceTypeSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: virtualKeyword = child.token(); return;
        case 1: interfaceKeyword = child.token(); return;
        case 2: name = child.token(); return;
        case 3: parameters = child.node() ? &child.node()->as<ParameterValueAssignmentSyntax>() : nullptr; return;
        case 4: modport = child.node() ? &child.node()->as<DotMemberClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}